

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solve2right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SVectorBase<double> *b,SSVectorBase<double> *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *pdVar6;
  double *pdVar7;
  int *piVar8;
  double *pdVar9;
  Real RVar10;
  SSVectorBase<double> *pSVar11;
  long lVar12;
  SSVectorBase<double> *pSVar13;
  int rsize;
  int n;
  int f;
  SSVectorBase<double> *local_70;
  SSVectorBase<double> *local_68;
  Real local_60;
  int *local_58;
  int *local_50;
  double *local_48;
  undefined8 uStack_40;
  
  (*this->solveTime->_vptr_Timer[3])();
  local_50 = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  rsize = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  local_58 = (rhs->super_IdxSet).idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_60 = Tolerances::epsilon(this_00);
  local_68 = rhs;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  local_70 = y;
  SSVectorBase<double>::clear(y);
  this->usetup = true;
  SSVectorBase<double>::clear(&this->ssvec);
  iVar1 = b->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar1) {
    lVar12 = 0;
    do {
      iVar2 = *(int *)((long)&b->m_elem->idx + lVar12);
      local_48 = *(double **)((long)&b->m_elem->val + lVar12);
      uStack_40 = 0;
      RVar10 = Tolerances::epsilon((this->ssvec)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS((double)local_48) <= RVar10) {
        pdVar4[iVar2] = 0.0;
      }
      else {
        pdVar4[iVar2] = (double)local_48;
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar12);
  }
  pSVar13 = local_68;
  pSVar11 = local_70;
  (this->ssvec).setupStatus = true;
  if ((this->super_CLUFactor<double>).l.updateType == 0) {
    n = (this->ssvec).super_IdxSet.num;
    x->setupStatus = false;
    piVar5 = (x->super_IdxSet).idx;
    pdVar6 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_70->setupStatus = false;
    piVar8 = (local_70->super_IdxSet).idx;
    pdVar9 = (local_70->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_68->setupStatus = false;
    CLUFactor<double>::vSolveRight4update2sparse
              (&this->super_CLUFactor<double>,local_60,pdVar6,piVar5,pdVar7,local_50,&n,local_60,
               pdVar9,piVar8,
               (local_68->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,local_58,&rsize,(double *)0x0,(int *)0x0,(int *)0x0);
    x->setupStatus = false;
    (x->super_IdxSet).num = n;
    pSVar11->setupStatus = false;
    (pSVar11->super_IdxSet).num = rsize;
    SSVectorBase<double>::setup_and_assign<double>(&this->eta,x);
  }
  else {
    SSVectorBase<double>::clear(&this->forest);
    pSVar13 = local_68;
    pSVar11 = local_70;
    n = (this->ssvec).super_IdxSet.num;
    x->setupStatus = false;
    piVar5 = (x->super_IdxSet).idx;
    pdVar6 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_70->setupStatus = false;
    piVar8 = (local_70->super_IdxSet).idx;
    local_48 = (local_70->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_68->setupStatus = false;
    pdVar9 = (local_68->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->forest).setupStatus = false;
    CLUFactor<double>::vSolveRight4update2sparse
              (&this->super_CLUFactor<double>,local_60,pdVar6,piVar5,pdVar7,local_50,&n,local_60,
               local_48,piVar8,pdVar9,local_58,&rsize,
               (this->forest).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,&f,(this->forest).super_IdxSet.idx);
    (x->super_IdxSet).num = n;
    x->setupStatus = true;
    (pSVar11->super_IdxSet).num = rsize;
    pSVar11->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  pSVar13->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      nullptr, nullptr, nullptr);
      x.setSize(n);
      //      x.forceSetup();
      x.unSetup();
      y.setSize(rsize);
      y.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      forest.altValues(), &f, forest.altIndexMem());
      x.setSize(n);
      x.forceSetup();
      y.setSize(rsize);
      y.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}